

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O3

void __thiscall
xmrig::DaemonClient::DaemonClient(DaemonClient *this,int id,IClientListener *listener)

{
  Timer *this_00;
  
  BaseClient::BaseClient(&this->super_BaseClient,id,listener);
  (this->super_BaseClient).super_IClient._vptr_IClient = (_func_int **)&PTR__DaemonClient_001aca70;
  (this->super_ITimerListener)._vptr_ITimerListener = (_func_int **)&PTR__DaemonClient_001acb60;
  (this->super_IHttpListener)._vptr_IHttpListener = (_func_int **)&PTR__DaemonClient_001acb88;
  this->m_monero = true;
  (this->m_blocktemplate).m_data = (char *)0x0;
  (this->m_blocktemplate).m_size = 0;
  (this->m_prevHash).m_data = (char *)0x0;
  (this->m_prevHash).m_size = 0;
  (this->m_tlsFingerprint).m_data = (char *)0x0;
  (this->m_tlsFingerprint).m_size = 0;
  (this->m_tlsVersion).m_data = (char *)0x0;
  (this->m_tlsVersion).m_size = 0;
  this_00 = (Timer *)operator_new(0x10);
  Timer::Timer(this_00,&this->super_ITimerListener);
  this->m_timer = this_00;
  return;
}

Assistant:

xmrig::DaemonClient::DaemonClient(int id, IClientListener *listener) :
    BaseClient(id, listener),
    m_monero(true)
{
    m_timer = new Timer(this);
}